

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Args::Args(Args *this,int argc,char **argv)

{
  char **__last;
  char *__s;
  char **__first;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_35 [20];
  allocator<char> local_21;
  char **local_20;
  char **argv_local;
  Args *pAStack_10;
  int argc_local;
  Args *this_local;
  
  __s = *argv;
  local_20 = argv;
  argv_local._4_4_ = argc;
  pAStack_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)this,__s,&local_21);
  ::std::allocator<char>::~allocator(&local_21);
  __first = local_20 + 1;
  __last = local_20 + argv_local._4_4_;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_35);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<char_const*const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_args,
             __first,__last,local_35);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_35);
  return;
}

Assistant:

Args( int argc, char const* const* argv )
            : m_exeName(argv[0]),
              m_args(argv + 1, argv + argc) {}